

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<ExpressionStatementAstNode>_> * __thiscall
Parser::parseExpressionStatement
          (optional<std::shared_ptr<ExpressionStatementAstNode>_> *__return_storage_ptr__,
          Parser *this)

{
  bool bVar1;
  shared_ptr<ExpressionAstNode> local_80;
  undefined4 local_70;
  allocator<char> local_69;
  string local_68 [32];
  undefined1 local_48 [23];
  undefined1 local_31;
  undefined1 local_30 [7];
  bool error;
  optional<std::shared_ptr<ExpressionAstNode>_> expr;
  Parser *this_local;
  
  expr.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ = this;
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_30,this);
  local_31 = (_Alloc_hider)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,"Expected a semicolon following expression statement",&local_69);
  expect((Parser *)local_48,(TokenType)this,(bool *)0x10,(string *)&local_31);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  if (((byte)local_31 & 1) == 0) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_30);
    if (bVar1) {
      std::optional<std::shared_ptr<ExpressionAstNode>_>::value
                ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_30);
      std::make_shared<ExpressionStatementAstNode,std::shared_ptr<ExpressionAstNode>&>(&local_80);
      std::optional<std::shared_ptr<ExpressionStatementAstNode>_>::
      optional<std::shared_ptr<ExpressionStatementAstNode>,_true>
                (__return_storage_ptr__,(shared_ptr<ExpressionStatementAstNode> *)&local_80);
      std::shared_ptr<ExpressionStatementAstNode>::~shared_ptr
                ((shared_ptr<ExpressionStatementAstNode> *)&local_80);
      goto LAB_00113943;
    }
  }
  std::optional<std::shared_ptr<ExpressionStatementAstNode>_>::optional(__return_storage_ptr__);
LAB_00113943:
  local_70 = 1;
  std::optional<std::shared_ptr<ExpressionAstNode>_>::~optional
            ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ExpressionStatementAstNode>>
Parser::parseExpressionStatement() noexcept {
  auto expr = this->parseExpression();
  bool error = false;
  this->expect(TokenType::SemiColon, error, "Expected a semicolon following expression statement");

  if (error || !expr) {
    return std::nullopt;
  }

  return std::make_shared<ExpressionStatementAstNode>(expr.value());
}